

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt.cpp
# Opt level: O0

vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
* transform(PatternList *pattern)

{
  initializer_list<std::shared_ptr<docopt::Pattern>_> __l;
  bool bVar1;
  element_type *peVar2;
  vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
  *in_RDI;
  PatternList group_2;
  BranchPattern *branch;
  PatternList group_1;
  PatternList *subchildren;
  OneOrMore *oneOrMore;
  PatternList group;
  shared_ptr<docopt::Pattern> *eitherChild;
  const_iterator __end3;
  const_iterator __begin3;
  PatternList *__range3;
  Either *either;
  type child;
  __normal_iterator<std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
  child_iter;
  type children;
  vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
  groups;
  vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
  *result;
  vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  *in_stack_fffffffffffffcb8;
  vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  *in_stack_fffffffffffffcc0;
  vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  *in_stack_fffffffffffffcc8;
  iterator in_stack_fffffffffffffcd0;
  const_iterator in_stack_fffffffffffffcd8;
  BranchPattern *local_320;
  allocator_type *in_stack_fffffffffffffce8;
  vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  *in_stack_fffffffffffffcf0;
  iterator in_stack_fffffffffffffcf8;
  iterator in_stack_fffffffffffffd00;
  __normal_iterator<std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
  in_stack_fffffffffffffd08;
  iterator in_stack_fffffffffffffd10;
  const_iterator in_stack_fffffffffffffd18;
  BranchPattern *local_2e0;
  undefined8 **local_290;
  BranchPattern *local_270;
  vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  local_1e8;
  BranchPattern *local_1d0;
  shared_ptr<docopt::Pattern> *local_1c8;
  shared_ptr<docopt::Pattern> *local_1c0;
  shared_ptr<docopt::Pattern> *local_1b8;
  shared_ptr<docopt::Pattern> *local_1b0;
  shared_ptr<docopt::Pattern> *local_1a0;
  shared_ptr<docopt::Pattern> *local_198;
  shared_ptr<docopt::Pattern> *local_190;
  shared_ptr<docopt::Pattern> *local_188;
  shared_ptr<docopt::Pattern> local_178;
  PatternList *local_160;
  BranchPattern *local_158;
  shared_ptr<docopt::Pattern> *local_150;
  shared_ptr<docopt::Pattern> *local_148;
  shared_ptr<docopt::Pattern> *local_140;
  shared_ptr<docopt::Pattern> *local_138;
  undefined8 *local_120 [2];
  undefined1 **local_110;
  undefined8 local_108;
  reference local_e8;
  shared_ptr<docopt::Pattern> *local_e0;
  __normal_iterator<const_std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
  local_d8;
  PatternList *local_d0;
  BranchPattern *local_c8;
  shared_ptr<docopt::Pattern> *local_c0;
  __shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2> local_b0;
  undefined4 local_9c;
  shared_ptr<docopt::Pattern> *local_98;
  shared_ptr<docopt::Pattern> *local_88;
  shared_ptr<docopt::Pattern> *local_80;
  __normal_iterator<std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
  local_78;
  vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  *local_70;
  vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  *local_68;
  vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  local_58;
  vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
  local_30;
  byte local_11;
  
  local_11 = 0;
  std::
  vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
  ::vector((vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
            *)0x2b5e4f);
  std::
  vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
  ::vector((vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
            *)0x2b5e64);
  std::
  vector<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>,std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
  ::
  emplace_back<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>
            ((vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
              *)in_stack_fffffffffffffcd0._M_current,in_stack_fffffffffffffcc8);
  while (bVar1 = std::
                 vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
                 ::empty((vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
                          *)in_stack_fffffffffffffcd0._M_current), ((bVar1 ^ 0xffU) & 1) != 0) {
    std::
    vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
    ::operator[](&local_30,0);
    std::
    vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
    vector(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
    local_68 = (vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                *)std::
                  vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
                  ::begin((vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
                           *)in_stack_fffffffffffffcb8);
    __gnu_cxx::
    __normal_iterator<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>const*,std::vector<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>,std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>>
    ::
    __normal_iterator<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>*>
              ((__normal_iterator<const_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_*,_std::vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>_>
                *)in_stack_fffffffffffffcc0,
               (__normal_iterator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_*,_std::vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>_>
                *)in_stack_fffffffffffffcb8);
    local_70 = (vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                *)std::
                  vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
                  ::erase((vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
                           *)in_stack_fffffffffffffcd0._M_current,in_stack_fffffffffffffcd8);
    local_80 = (shared_ptr<docopt::Pattern> *)
               std::
               vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
               ::begin(in_stack_fffffffffffffcb8);
    local_88 = (shared_ptr<docopt::Pattern> *)
               std::
               vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
               ::end(in_stack_fffffffffffffcb8);
    local_78 = std::
               find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<docopt::Pattern>*,std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>,transform(std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>)::__0>
                         (local_80,local_88);
    local_98 = (shared_ptr<docopt::Pattern> *)
               std::
               vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
               ::end(in_stack_fffffffffffffcb8);
    bVar1 = __gnu_cxx::operator==
                      ((__normal_iterator<std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
                        *)in_stack_fffffffffffffcc0,
                       (__normal_iterator<std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
                        *)in_stack_fffffffffffffcb8);
    if (bVar1) {
      std::
      vector<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>,std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
      ::
      emplace_back<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>
                ((vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
                  *)in_stack_fffffffffffffcd0._M_current,in_stack_fffffffffffffcc8);
      local_9c = 2;
    }
    else {
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
      ::operator*(&local_78);
      std::shared_ptr<docopt::Pattern>::shared_ptr
                ((shared_ptr<docopt::Pattern> *)in_stack_fffffffffffffcc0,
                 (shared_ptr<docopt::Pattern> *)in_stack_fffffffffffffcb8);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<docopt::Pattern>const*,std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>
      ::__normal_iterator<std::shared_ptr<docopt::Pattern>*>
                ((__normal_iterator<const_std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
                  *)in_stack_fffffffffffffcc0,
                 (__normal_iterator<std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
                  *)in_stack_fffffffffffffcb8);
      local_c0 = (shared_ptr<docopt::Pattern> *)
                 std::
                 vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                 ::erase((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                          *)in_stack_fffffffffffffcd0._M_current,
                         (const_iterator)in_stack_fffffffffffffcd8._M_current);
      peVar2 = std::__shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>::get(&local_b0);
      if (peVar2 == (element_type *)0x0) {
        local_270 = (BranchPattern *)0x0;
      }
      else {
        local_270 = (BranchPattern *)
                    __dynamic_cast(peVar2,&docopt::Pattern::typeinfo,&docopt::Either::typeinfo,0);
      }
      local_c8 = local_270;
      if (local_270 == (BranchPattern *)0x0) {
        peVar2 = std::__shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>::get(&local_b0);
        if (peVar2 == (element_type *)0x0) {
          local_2e0 = (BranchPattern *)0x0;
        }
        else {
          local_2e0 = (BranchPattern *)
                      __dynamic_cast(peVar2,&docopt::Pattern::typeinfo,&docopt::OneOrMore::typeinfo,
                                     0);
        }
        local_158 = local_2e0;
        if (local_2e0 == (BranchPattern *)0x0) {
          in_stack_fffffffffffffce8 =
               (allocator_type *)
               std::__shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>::get(&local_b0);
          if (in_stack_fffffffffffffce8 == (allocator_type *)0x0) {
            local_320 = (BranchPattern *)0x0;
          }
          else {
            local_320 = (BranchPattern *)
                        __dynamic_cast(in_stack_fffffffffffffce8,&docopt::Pattern::typeinfo,
                                       &docopt::BranchPattern::typeinfo,0);
          }
          local_1d0 = local_320;
          in_stack_fffffffffffffcd8._M_current = docopt::BranchPattern::children(local_320);
          std::
          vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ::vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                    *)in_stack_fffffffffffffd10._M_current,
                   (vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                    *)in_stack_fffffffffffffd08._M_current);
          in_stack_fffffffffffffcc8 = &local_1e8;
          std::
          vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ::end(in_stack_fffffffffffffcb8);
          __gnu_cxx::
          __normal_iterator<std::shared_ptr<docopt::Pattern>const*,std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>
          ::__normal_iterator<std::shared_ptr<docopt::Pattern>*>
                    ((__normal_iterator<const_std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
                      *)in_stack_fffffffffffffcc0,
                     (__normal_iterator<std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
                      *)in_stack_fffffffffffffcb8);
          in_stack_fffffffffffffcc0 = &local_58;
          std::
          vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ::begin(in_stack_fffffffffffffcb8);
          std::
          vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ::end(in_stack_fffffffffffffcb8);
          in_stack_fffffffffffffcd0 =
               std::
               vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
               ::
               insert<__gnu_cxx::__normal_iterator<std::shared_ptr<docopt::Pattern>*,std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>,void>
                         ((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                           *)in_stack_fffffffffffffd00._M_current,in_stack_fffffffffffffd18,
                          (__normal_iterator<std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
                           )in_stack_fffffffffffffd10._M_current,in_stack_fffffffffffffd08);
          std::
          vector<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>,std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
          ::
          emplace_back<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>
                    ((vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
                      *)in_stack_fffffffffffffcd0._M_current,in_stack_fffffffffffffcc8);
          std::
          vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ::~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                     *)in_stack_fffffffffffffcd0._M_current);
        }
        else {
          in_stack_fffffffffffffd18._M_current =
               (shared_ptr<docopt::Pattern> *)docopt::BranchPattern::children(local_2e0);
          local_160 = (PatternList *)in_stack_fffffffffffffd18._M_current;
          std::
          vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ::vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                    *)in_stack_fffffffffffffd10._M_current,
                   (vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                    *)in_stack_fffffffffffffd08._M_current);
          in_stack_fffffffffffffd08._M_current = &local_178;
          local_188 = (shared_ptr<docopt::Pattern> *)
                      std::
                      vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                      ::end(in_stack_fffffffffffffcb8);
          __gnu_cxx::
          __normal_iterator<std::shared_ptr<docopt::Pattern>const*,std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>
          ::__normal_iterator<std::shared_ptr<docopt::Pattern>*>
                    ((__normal_iterator<const_std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
                      *)in_stack_fffffffffffffcc0,
                     (__normal_iterator<std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
                      *)in_stack_fffffffffffffcb8);
          local_190 = (shared_ptr<docopt::Pattern> *)
                      std::
                      vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                      ::begin(in_stack_fffffffffffffcb8);
          local_198 = (shared_ptr<docopt::Pattern> *)
                      std::
                      vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                      ::end(in_stack_fffffffffffffcb8);
          in_stack_fffffffffffffd10 =
               std::
               vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
               ::
               insert<__gnu_cxx::__normal_iterator<std::shared_ptr<docopt::Pattern>const*,std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>,void>
                         ((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                           *)in_stack_fffffffffffffd00._M_current,in_stack_fffffffffffffd18,
                          (__normal_iterator<const_std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
                           )in_stack_fffffffffffffd10._M_current,
                          (__normal_iterator<const_std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
                           )in_stack_fffffffffffffd08._M_current);
          in_stack_fffffffffffffcf8 = &local_178;
          local_1a0 = (shared_ptr<docopt::Pattern> *)in_stack_fffffffffffffd10;
          local_1b0 = (shared_ptr<docopt::Pattern> *)
                      std::
                      vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                      ::end(in_stack_fffffffffffffcb8);
          __gnu_cxx::
          __normal_iterator<std::shared_ptr<docopt::Pattern>const*,std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>
          ::__normal_iterator<std::shared_ptr<docopt::Pattern>*>
                    ((__normal_iterator<const_std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
                      *)in_stack_fffffffffffffcc0,
                     (__normal_iterator<std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
                      *)in_stack_fffffffffffffcb8);
          in_stack_fffffffffffffcf0 = &local_58;
          local_1b8 = (shared_ptr<docopt::Pattern> *)
                      std::
                      vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                      ::begin(in_stack_fffffffffffffcb8);
          local_1c0 = (shared_ptr<docopt::Pattern> *)
                      std::
                      vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                      ::end(in_stack_fffffffffffffcb8);
          in_stack_fffffffffffffd00 =
               std::
               vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
               ::
               insert<__gnu_cxx::__normal_iterator<std::shared_ptr<docopt::Pattern>*,std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>,void>
                         ((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                           *)in_stack_fffffffffffffd00._M_current,in_stack_fffffffffffffd18,
                          (__normal_iterator<std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
                           )in_stack_fffffffffffffd10._M_current,in_stack_fffffffffffffd08);
          local_1c8 = (shared_ptr<docopt::Pattern> *)in_stack_fffffffffffffd00;
          std::
          vector<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>,std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
          ::
          emplace_back<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>
                    ((vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
                      *)in_stack_fffffffffffffcd0._M_current,in_stack_fffffffffffffcc8);
          std::
          vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ::~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                     *)in_stack_fffffffffffffcd0._M_current);
        }
      }
      else {
        local_d0 = docopt::BranchPattern::children(local_270);
        local_d8._M_current =
             (shared_ptr<docopt::Pattern> *)
             std::
             vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
             ::begin(in_stack_fffffffffffffcb8);
        local_e0 = (shared_ptr<docopt::Pattern> *)
                   std::
                   vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                   ::end(in_stack_fffffffffffffcb8);
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<const_std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
                                   *)in_stack_fffffffffffffcc0,
                                  (__normal_iterator<const_std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
                                   *)in_stack_fffffffffffffcb8), bVar1) {
          local_e8 = __gnu_cxx::
                     __normal_iterator<const_std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
                     ::operator*(&local_d8);
          std::shared_ptr<docopt::Pattern>::shared_ptr
                    ((shared_ptr<docopt::Pattern> *)in_stack_fffffffffffffcc0,
                     (shared_ptr<docopt::Pattern> *)in_stack_fffffffffffffcb8);
          local_108 = 1;
          local_110 = (undefined1 **)local_120;
          std::allocator<std::shared_ptr<docopt::Pattern>_>::allocator
                    ((allocator<std::shared_ptr<docopt::Pattern>_> *)0x2b61c4);
          __l._M_len = (size_type)in_stack_fffffffffffffd00._M_current;
          __l._M_array = in_stack_fffffffffffffcf8;
          std::
          vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ::vector(in_stack_fffffffffffffcf0,__l,in_stack_fffffffffffffce8);
          std::allocator<std::shared_ptr<docopt::Pattern>_>::~allocator
                    ((allocator<std::shared_ptr<docopt::Pattern>_> *)0x2b61f8);
          local_290 = &local_110;
          do {
            local_290 = local_290 + -2;
            std::shared_ptr<docopt::Pattern>::~shared_ptr((shared_ptr<docopt::Pattern> *)0x2b622d);
          } while (local_290 != local_120);
          local_138 = (shared_ptr<docopt::Pattern> *)
                      std::
                      vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                      ::end(in_stack_fffffffffffffcb8);
          __gnu_cxx::
          __normal_iterator<std::shared_ptr<docopt::Pattern>const*,std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>
          ::__normal_iterator<std::shared_ptr<docopt::Pattern>*>
                    ((__normal_iterator<const_std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
                      *)in_stack_fffffffffffffcc0,
                     (__normal_iterator<std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
                      *)in_stack_fffffffffffffcb8);
          local_140 = (shared_ptr<docopt::Pattern> *)
                      std::
                      vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                      ::begin(in_stack_fffffffffffffcb8);
          local_148 = (shared_ptr<docopt::Pattern> *)
                      std::
                      vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                      ::end(in_stack_fffffffffffffcb8);
          local_150 = (shared_ptr<docopt::Pattern> *)
                      std::
                      vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                      ::
                      insert<__gnu_cxx::__normal_iterator<std::shared_ptr<docopt::Pattern>*,std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>,void>
                                ((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                                  *)in_stack_fffffffffffffd00._M_current,in_stack_fffffffffffffd18,
                                 (__normal_iterator<std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
                                  )in_stack_fffffffffffffd10._M_current,in_stack_fffffffffffffd08);
          std::
          vector<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>,std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>>
          ::
          emplace_back<std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>
                    ((vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
                      *)in_stack_fffffffffffffcd0._M_current,in_stack_fffffffffffffcc8);
          std::
          vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ::~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                     *)in_stack_fffffffffffffcd0._M_current);
          __gnu_cxx::
          __normal_iterator<const_std::shared_ptr<docopt::Pattern>_*,_std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>
          ::operator++(&local_d8);
        }
      }
      std::shared_ptr<docopt::Pattern>::~shared_ptr((shared_ptr<docopt::Pattern> *)0x2b6729);
      local_9c = 0;
    }
    std::
    vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
    ~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
             *)in_stack_fffffffffffffcd0._M_current);
  }
  local_11 = 1;
  local_9c = 1;
  std::
  vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
  ::~vector((vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
             *)in_stack_fffffffffffffcd0._M_current);
  if ((local_11 & 1) == 0) {
    std::
    vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
    ::~vector((vector<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>,_std::allocator<std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>_>_>
               *)in_stack_fffffffffffffcd0._M_current);
  }
  return in_RDI;
}

Assistant:

std::vector<PatternList> transform(PatternList pattern)
{
	std::vector<PatternList> result;
	
	std::vector<PatternList> groups;
	groups.emplace_back(std::move(pattern));
	
	while(!groups.empty()) {
		// pop off the first element
		auto children = std::move(groups[0]);
		groups.erase(groups.begin());
		
		// find the first branch node in the list
		auto child_iter = std::find_if(children.begin(), children.end(), [](std::shared_ptr<Pattern> const& p) {
			return dynamic_cast<BranchPattern const*>(p.get());
		});
		
		// no branch nodes left : expansion is complete for this grouping
		if (child_iter == children.end()) {
			result.emplace_back(std::move(children));
			continue;
		}
		
		// pop the child from the list
		auto child = std::move(*child_iter);
		children.erase(child_iter);
		
		// expand the branch in the appropriate way
		if (Either* either = dynamic_cast<Either*>(child.get())) {
			// "[e] + children" for each child 'e' in Either
			for(auto const& eitherChild : either->children()) {
				PatternList group = { eitherChild };
				group.insert(group.end(), children.begin(), children.end());
				
				groups.emplace_back(std::move(group));
			}
		} else if (OneOrMore* oneOrMore = dynamic_cast<OneOrMore*>(child.get())) {
			// child.children * 2 + children
			auto const& subchildren = oneOrMore->children();
			PatternList group = subchildren;
			group.insert(group.end(), subchildren.begin(), subchildren.end());
			group.insert(group.end(), children.begin(), children.end());
			
			groups.emplace_back(std::move(group));
		} else { // Required, Optional, OptionsShortcut
			BranchPattern* branch = dynamic_cast<BranchPattern*>(child.get());
			
			// child.children + children
			PatternList group = branch->children();
			group.insert(group.end(), children.begin(), children.end());
			
			groups.emplace_back(std::move(group));
		}
	}
	
	return result;
}